

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inja.hpp
# Opt level: O1

bool __thiscall inja::Parser::parse_expression_and(Parser *this,Template *tmpl)

{
  Token *pTVar1;
  size_t sVar2;
  undefined4 uVar3;
  bool bVar4;
  int iVar5;
  Token local_40;
  
  bVar4 = parse_expression_not(this,tmpl);
  if (bVar4) {
    if ((this->m_tok).kind != Id) {
      return true;
    }
    if ((this->m_tok).text._M_len != 3) {
      return true;
    }
    iVar5 = bcmp((this->m_tok).text._M_str,"and",3);
    if (iVar5 != 0) {
      return true;
    }
    pTVar1 = &this->m_tok;
    if (this->m_have_peek_tok == true) {
      (this->m_tok).text._M_str = (this->m_peek_tok).text._M_str;
      uVar3 = *(undefined4 *)&(this->m_peek_tok).field_0x4;
      sVar2 = (this->m_peek_tok).text._M_len;
      pTVar1->kind = (this->m_peek_tok).kind;
      *(undefined4 *)&pTVar1->field_0x4 = uVar3;
      (this->m_tok).text._M_len = sVar2;
      this->m_have_peek_tok = false;
    }
    else {
      Lexer::scan(&local_40,&this->m_lexer);
      (this->m_tok).text._M_str = local_40.text._M_str;
      pTVar1->kind = local_40.kind;
      *(undefined4 *)&pTVar1->field_0x4 = local_40._4_4_;
      (this->m_tok).text._M_len = local_40.text._M_len;
    }
    bVar4 = parse_expression_not(this,tmpl);
    if (bVar4) {
      append_function(this,tmpl,And,2);
      return true;
    }
  }
  return false;
}

Assistant:

bool parse_expression_and(Template& tmpl) {
    if (!parse_expression_not(tmpl)) return false;
    if (m_tok.kind != Token::Kind::Id || m_tok.text != static_cast<decltype(m_tok.text)>("and")) return true;
    get_next_token();
    if (!parse_expression_not(tmpl)) return false;
    append_function(tmpl, Bytecode::Op::And, 2);
    return true;
  }